

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall
HighsSplitDeque::
push<HighsMipSolverData::startSymmetryDetection(highs::parallel::TaskGroup_const&,std::unique_ptr<HighsMipSolverData::SymmetryDetectionData,std::default_delete<HighsMipSolverData::SymmetryDetectionData>>&)::__0>
          (HighsSplitDeque *this,anon_class_16_2_663289be_for_functor *f)

{
  int iVar1;
  bool bVar2;
  uint64_t uVar3;
  element_type *peVar4;
  HighsSplitDeque *in_RSI;
  WorkerBunk *in_RDI;
  HighsSplitDeque *in_stack_00000030;
  int haveJobs;
  memory_order __b;
  size_type in_stack_ffffffffffffff78;
  array<HighsTask,_8192UL> *in_stack_ffffffffffffff80;
  memory_order __m;
  anon_class_16_2_663289be_for_functor *in_stack_ffffffffffffff88;
  HighsTask *in_stack_ffffffffffffff90;
  atomic<bool> *paVar5;
  atomic<bool> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  WorkerBunk *this_01;
  
  if (*(uint *)&in_RDI->field_0x20 < 0x2000) {
    *(int *)&in_RDI->field_0x20 = *(int *)&in_RDI->field_0x20 + 1;
    this_01 = in_RDI;
    std::array<HighsTask,_8192UL>::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __m = (memory_order)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    HighsTask::
    setTaskData<HighsMipSolverData::startSymmetryDetection(highs::parallel::TaskGroup_const&,std::unique_ptr<HighsMipSolverData::SymmetryDetectionData,std::default_delete<HighsMipSolverData::SymmetryDetectionData>>&)::__0>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if ((in_RDI->field_0x38 & 1) == 0) {
      growShared(in_stack_00000030);
    }
    else {
      paVar5 = (atomic<bool> *)&in_RDI[1].field_0x10;
      uVar3 = makeTailSplit(*(uint32_t *)&in_RDI->field_0x20 - 1,*(uint32_t *)&in_RDI->field_0x20);
      this_00 = paVar5;
      std::operator&(memory_order_release,__memory_order_mask);
      *(uint64_t *)this_00 = uVar3;
      std::atomic<bool>::store(this_00,SUB81((ulong)paVar5 >> 0x38,0),(memory_order)paVar5);
      *(undefined4 *)&in_RDI->field_0x24 = *(undefined4 *)&in_RDI->field_0x20;
      in_RDI->field_0x38 = 0;
      bVar2 = std::atomic<bool>::load((atomic<bool> *)in_stack_ffffffffffffff88,__m);
      if (bVar2) {
        std::atomic<bool>::store(this_00,SUB81((ulong)paVar5 >> 0x38,0),(memory_order)paVar5);
      }
      peVar4 = std::
               __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x6300d0);
      LOCK();
      iVar1 = (peVar4->haveJobs).super___atomic_base<int>._M_i;
      (peVar4->haveJobs).super___atomic_base<int>._M_i =
           (peVar4->haveJobs).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (iVar1 < *(int *)&in_RDI->field_0x28 + -1) {
        std::
        __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6301a0);
        WorkerBunk::publishWork(this_01,in_RSI);
      }
    }
  }
  else {
    if ((*(uint *)&in_RDI->field_0x24 < 0x2000) && ((in_RDI->field_0x38 & 1) == 0)) {
      growShared(in_stack_00000030);
    }
    *(int *)&in_RDI->field_0x20 = *(int *)&in_RDI->field_0x20 + 1;
    HighsTask::
    Callable<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsMipSolverData.cpp:390:21)>
    ::anon_class_16_2_663289be_for_functor::operator()
              ((anon_class_16_2_663289be_for_functor *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return;
}

Assistant:

void push(F&& f) {
    if (ownerData.head >= kTaskArraySize) {
      // task queue is full, execute task directly
      if (ownerData.splitCopy < kTaskArraySize && !ownerData.allStolenCopy)
        growShared();

      ownerData.head += 1;
      f();
      return;
    }

    taskArray[ownerData.head++].setTaskData(std::forward<F>(f));
    if (ownerData.allStolenCopy) {
      assert(ownerData.head > 0);
      stealerData.ts.store(makeTailSplit(ownerData.head - 1, ownerData.head),
                           std::memory_order_release);
      stealerData.allStolen.store(false, std::memory_order_relaxed);
      ownerData.splitCopy = ownerData.head;
      ownerData.allStolenCopy = false;
      if (splitRequest.load(std::memory_order_relaxed))
        splitRequest.store(false, std::memory_order_relaxed);

      int haveJobs = ownerData.workerBunk->haveJobs.fetch_add(
          1, std::memory_order_release);
      if (haveJobs < ownerData.numWorkers - 1)
        ownerData.workerBunk->publishWork(this);
    } else
      growShared();
  }